

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeSetStopTime(void *arkode_mem,sunrealtype tstop)

{
  long in_RDI;
  ARKodeMem in_XMM0_Qa;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x482,"ARKodeSetStopTime",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if ((*(long *)(in_RDI + 0x310) < 1) ||
          (0.0 <= ((double)in_XMM0_Qa - *(double *)(in_RDI + 0x2d0)) * *(double *)(in_RDI + 0x2a0)))
  {
    *(ARKodeMem *)(in_RDI + 0x290) = in_XMM0_Qa;
    *(undefined4 *)(in_RDI + 0x288) = 1;
    local_4 = 0;
  }
  else {
    arkProcessError(in_XMM0_Qa,*(int *)(in_RDI + 0x2d0),(int)in_RDI,(char *)0xffffffea,(char *)0x490
                    ,"ARKodeSetStopTime",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,
                    "The value tstop = %lg is behind current t = %lg in the direction of integration."
                   );
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int ARKodeSetStopTime(void* arkode_mem, sunrealtype tstop)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* If ARKODE was called at least once, test if tstop is legal
     (i.e. if it was not already passed).
     If ARKodeSetStopTime is called before the first call to ARKODE,
     tstop will be checked in ARKODE. */
  if (ark_mem->nst > 0)
  {
    if ((tstop - ark_mem->tcur) * ark_mem->h < ZERO)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_BAD_TSTOP, tstop, ark_mem->tcur);
      return (ARK_ILL_INPUT);
    }
  }

  ark_mem->tstop    = tstop;
  ark_mem->tstopset = SUNTRUE;

  return (ARK_SUCCESS);
}